

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall cs::instance_type::parse_using(instance_type *this,iterator it,bool override)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  token_base **pptVar4;
  element_type *this_00;
  string *str;
  byte in_DL;
  tree_node *in_RDI;
  var ns;
  tree_type<cs::token_base_*> *t;
  iterator __end2;
  iterator __begin2;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range2;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *parallel_list;
  undefined1 in_stack_0000084f;
  iterator *in_stack_00000850;
  runtime_type *in_stack_00000858;
  _Self *in_stack_ffffffffffffff08;
  _Self *in_stack_ffffffffffffff10;
  runtime_error *this_01;
  type_info *in_stack_ffffffffffffff18;
  type_info *in_stack_ffffffffffffff20;
  undefined1 is_override;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  exception in_stack_ffffffffffffff4f;
  domain_manager *in_stack_ffffffffffffff50;
  any *in_stack_ffffffffffffff90;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_48;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_28;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *pdVar5;
  undefined7 in_stack_ffffffffffffffe8;
  iterator it_00;
  
  bVar1 = in_DL & 1;
  it_00.mData = in_RDI;
  pptVar4 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_ffffffffffffff50);
  is_override = (undefined1)((ulong)in_RDI >> 0x38);
  iVar3 = (*(*pptVar4)->_vptr_token_base[2])();
  if (iVar3 == 0xf) {
    pptVar4 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_ffffffffffffff50);
    local_28 = token_parallel::get_parallel((token_parallel *)*pptVar4);
    pdVar5 = local_28;
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           *)in_stack_ffffffffffffff08);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_ffffffffffffff08);
    while (bVar2 = std::operator!=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08), bVar2) {
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator*(&local_48);
      tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff08);
      parse_using((instance_type *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),it_00,
                  SUB81((ulong)pdVar5 >> 0x38,0));
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator++(in_stack_ffffffffffffff10);
    }
  }
  else {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x4f9173);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x4f917f);
    runtime_type::parse_expr(in_stack_00000858,in_stack_00000850,(bool)in_stack_0000084f);
    cs_impl::any::type((any *)in_stack_ffffffffffffff10);
    bVar2 = std::type_info::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (!bVar2) {
      str = (string *)__cxa_allocate_exception(0x28);
      this_01 = (runtime_error *)&stack0xffffffffffffff4f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff50,"Only support involve namespace.",
                 (allocator *)this_01);
      runtime_error::runtime_error(this_01,str);
      __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x4f91da);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x4f91e6);
    cs_impl::any::const_val<std::shared_ptr<cs::name_space>>(in_stack_ffffffffffffff90);
    this_00 = std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4f920a);
    name_space::get_domain(this_00);
    domain_manager::involve_domain
              (in_stack_ffffffffffffff50,
               (domain_type *)
               CONCAT17(in_stack_ffffffffffffff4f,
                        CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)),
               (bool)is_override);
    cs_impl::any::~any((any *)0x4f9303);
  }
  return;
}

Assistant:

void instance_type::parse_using(tree_type<token_base *>::iterator it, bool override)
	{
		if (it.data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(it.data())->get_parallel();
			for (auto &t: parallel_list)
				parse_using(t.root());
		}
		else {
			var ns = context->instance->parse_expr(it, true);
			if (ns.type() == typeid(namespace_t))
				context->instance->storage.involve_domain(ns.const_val<namespace_t>()->get_domain(), override);
			else
				throw runtime_error("Only support involve namespace.");
		}
	}